

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_while_loop_initializers(CompilerGLSL *this,SPIRBlock *block)

{
  TypedID<(spirv_cross::Types)2> *pTVar1;
  size_t sVar2;
  SPIRVariable *pSVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar1 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
           ptr;
  sVar2 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          buffer_size;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    pSVar3 = Compiler::get<spirv_cross::SPIRVariable>
                       (&this->super_Compiler,*(uint32_t *)((long)&pTVar1->id + lVar4));
    (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_50,this,pSVar3);
    statement<std::__cxx11::string,char_const(&)[2]>(this,&local_50,(char (*) [2])0x39d4f0);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_while_loop_initializers(const SPIRBlock &block)
{
	// While loops do not take initializers, so declare all of them outside.
	for (auto &loop_var : block.loop_variables)
	{
		auto &var = get<SPIRVariable>(loop_var);
		statement(variable_decl(var), ";");
	}
}